

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptSamplerTypeDX9(HlslGrammar *this,TType *type)

{
  bool bVar1;
  TBasicType t;
  int iVar2;
  undefined4 extraout_var;
  TType local_170;
  TSampler local_d4;
  TArraySizes *pTStack_d0;
  TSampler sampler;
  TArraySizes *arraySizes;
  undefined1 local_c0 [7];
  bool isShadow;
  TType txType;
  TSamplerDim dim;
  EHlslTokenClass samplerType;
  TType *type_local;
  HlslGrammar *this_local;
  
  txType.spirvType._4_4_ = HlslTokenStream::peek(&this->super_HlslTokenStream);
  txType.spirvType._0_4_ = EsdNone;
  TType::TType((TType *)local_c0,EbtFloat,EvqUniform,4,0,0,false);
  switch(txType.spirvType._4_4_) {
  case EHTokSampler:
    txType.spirvType._0_4_ = Esd2D;
    break;
  case EHTokSampler1d:
    txType.spirvType._0_4_ = Esd1D;
    break;
  case EHTokSampler2d:
    txType.spirvType._0_4_ = Esd2D;
    break;
  case EHTokSampler3d:
    txType.spirvType._0_4_ = Esd3D;
    break;
  case EHTokSamplerCube:
    txType.spirvType._0_4_ = EsdCube;
    break;
  default:
    this_local._7_1_ = false;
    goto LAB_005a9f3f;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  pTStack_d0 = (TArraySizes *)0x0;
  t = TType::getBasicType((TType *)local_c0);
  TSampler::set(&local_d4,t,(TSamplerDim)txType.spirvType,false,false,false);
  bVar1 = HlslParseContext::setTextureReturnType
                    (this->parseContext,&local_d4,(TType *)local_c0,
                     &(this->super_HlslTokenStream).token.loc);
  if (bVar1) {
    TType::TType(&local_170,&local_d4,EvqUniform,pTStack_d0);
    TType::shallowCopy(type,&local_170);
    TType::~TType(&local_170);
    iVar2 = (*type->_vptr_TType[10])();
    *(undefined1 *)(CONCAT44(extraout_var,iVar2) + 0x2c) = 0;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_005a9f3f:
  TType::~TType((TType *)local_c0);
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptSamplerTypeDX9(TType &type)
{
    // read sampler type
    const EHlslTokenClass samplerType = peek();

    TSamplerDim dim = EsdNone;
    TType txType(EbtFloat, EvqUniform, 4); // default type is float4

    bool isShadow = false;

    switch (samplerType)
    {
    case EHTokSampler:		dim = Esd2D;	break;
    case EHTokSampler1d:	dim = Esd1D;	break;
    case EHTokSampler2d:	dim = Esd2D;	break;
    case EHTokSampler3d:	dim = Esd3D;	break;
    case EHTokSamplerCube:	dim = EsdCube;	break;
    default:
        return false; // not a dx9 sampler declaration
    }

    advanceToken(); // consume the sampler type keyword

    TArraySizes *arraySizes = nullptr; // TODO: array

    TSampler sampler;
    sampler.set(txType.getBasicType(), dim, false, isShadow, false);

    if (!parseContext.setTextureReturnType(sampler, txType, token.loc))
        return false;

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));
    type.getQualifier().layoutFormat = ElfNone;

    return true;
}